

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O1

bool Function_Template::form5_Histogram(HistogramForm5 Histogram)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined8 uVar3;
  byte bVar4;
  byte bVar5;
  uint uVar6;
  long lVar7;
  bool bVar8;
  ushort uVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  uint uVar16;
  undefined1 auVar17 [64];
  Image mask;
  Image image;
  vector<unsigned_int,_std::allocator<unsigned_int>_> histogram;
  ImageTemplate<unsigned_char> local_88;
  Image local_60;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  
  bVar5 = Unit_Test::intensityValue();
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_88,0,0,'\x01','\x01');
  Test_Helper::uniformImage(&local_60,bVar5,0,0,&local_88);
  local_88._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00219948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_88);
  bVar8 = true;
  if (1 < local_60._height) {
    PenguinV_Image::ImageTemplate<unsigned_char>::generate
              (&local_88,&local_60,local_60._width,local_60._height,local_60._colorCount,'\x01');
    Unit_Test::fillImage(&local_88,0,0,local_88._width,local_88._height >> 1,0xff);
    Unit_Test::fillImage
              (&local_88,0,local_88._height >> 1,local_88._width,
               local_88._height - (local_88._height >> 1),'\0');
    (*Histogram)(&local_38,&local_60,&local_88);
    if ((long)local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start == 0x400) {
      uVar6 = (local_60._height >> 1) * local_60._width;
      bVar8 = false;
      uVar16 = 0;
      if (local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[bVar5] == uVar6) {
        if (local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          auVar11 = vpbroadcastq_avx512f();
          auVar11 = vpsrlq_avx512f(auVar11,2);
          auVar17 = ZEXT1664((undefined1  [16])0x0);
          lVar7 = 0;
          auVar12 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
          auVar13 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          do {
            auVar14 = vmovdqa64_avx512f(auVar17);
            auVar17 = vpbroadcastq_avx512f();
            auVar15 = vporq_avx512f(auVar17,auVar12);
            auVar17 = vporq_avx512f(auVar17,auVar13);
            uVar3 = vpcmpuq_avx512f(auVar17,auVar11,2);
            bVar5 = (byte)uVar3;
            uVar3 = vpcmpuq_avx512f(auVar15,auVar11,2);
            bVar4 = (byte)uVar3;
            uVar9 = CONCAT11(bVar4,bVar5);
            auVar17 = vmovdqu32_avx512f(*(undefined1 (*) [64])
                                         (local_38.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_start + lVar7));
            auVar15._4_4_ = (uint)((byte)(uVar9 >> 1) & 1) * auVar17._4_4_;
            auVar15._0_4_ = (uint)(bVar5 & 1) * auVar17._0_4_;
            auVar15._8_4_ = (uint)((byte)(uVar9 >> 2) & 1) * auVar17._8_4_;
            auVar15._12_4_ = (uint)((byte)(uVar9 >> 3) & 1) * auVar17._12_4_;
            auVar15._16_4_ = (uint)((byte)(uVar9 >> 4) & 1) * auVar17._16_4_;
            auVar15._20_4_ = (uint)((byte)(uVar9 >> 5) & 1) * auVar17._20_4_;
            auVar15._24_4_ = (uint)((byte)(uVar9 >> 6) & 1) * auVar17._24_4_;
            auVar15._28_4_ = (uint)((byte)(uVar9 >> 7) & 1) * auVar17._28_4_;
            auVar15._32_4_ = (uint)(bVar4 & 1) * auVar17._32_4_;
            auVar15._36_4_ = (uint)(bVar4 >> 1 & 1) * auVar17._36_4_;
            auVar15._40_4_ = (uint)(bVar4 >> 2 & 1) * auVar17._40_4_;
            auVar15._44_4_ = (uint)(bVar4 >> 3 & 1) * auVar17._44_4_;
            auVar15._48_4_ = (uint)(bVar4 >> 4 & 1) * auVar17._48_4_;
            auVar15._52_4_ = (uint)(bVar4 >> 5 & 1) * auVar17._52_4_;
            auVar15._56_4_ = (uint)(bVar4 >> 6 & 1) * auVar17._56_4_;
            auVar15._60_4_ = (uint)(bVar4 >> 7) * auVar17._60_4_;
            auVar17 = vpaddd_avx512f(auVar15,auVar14);
            lVar7 = lVar7 + 0x10;
          } while (lVar7 != 0x100);
          auVar11 = vmovdqa32_avx512f(auVar17);
          auVar12._0_4_ =
               (uint)(bVar5 & 1) * auVar11._0_4_ | (uint)!(bool)(bVar5 & 1) * auVar14._0_4_;
          bVar8 = (bool)((byte)(uVar9 >> 1) & 1);
          auVar12._4_4_ = (uint)bVar8 * auVar11._4_4_ | (uint)!bVar8 * auVar14._4_4_;
          bVar8 = (bool)((byte)(uVar9 >> 2) & 1);
          auVar12._8_4_ = (uint)bVar8 * auVar11._8_4_ | (uint)!bVar8 * auVar14._8_4_;
          bVar8 = (bool)((byte)(uVar9 >> 3) & 1);
          auVar12._12_4_ = (uint)bVar8 * auVar11._12_4_ | (uint)!bVar8 * auVar14._12_4_;
          bVar8 = (bool)((byte)(uVar9 >> 4) & 1);
          auVar12._16_4_ = (uint)bVar8 * auVar11._16_4_ | (uint)!bVar8 * auVar14._16_4_;
          bVar8 = (bool)((byte)(uVar9 >> 5) & 1);
          auVar12._20_4_ = (uint)bVar8 * auVar11._20_4_ | (uint)!bVar8 * auVar14._20_4_;
          bVar8 = (bool)((byte)(uVar9 >> 6) & 1);
          auVar12._24_4_ = (uint)bVar8 * auVar11._24_4_ | (uint)!bVar8 * auVar14._24_4_;
          bVar8 = (bool)((byte)(uVar9 >> 7) & 1);
          auVar12._28_4_ = (uint)bVar8 * auVar11._28_4_ | (uint)!bVar8 * auVar14._28_4_;
          auVar12._32_4_ =
               (uint)(bVar4 & 1) * auVar11._32_4_ | (uint)!(bool)(bVar4 & 1) * auVar14._32_4_;
          bVar8 = (bool)(bVar4 >> 1 & 1);
          auVar12._36_4_ = (uint)bVar8 * auVar11._36_4_ | (uint)!bVar8 * auVar14._36_4_;
          bVar8 = (bool)(bVar4 >> 2 & 1);
          auVar12._40_4_ = (uint)bVar8 * auVar11._40_4_ | (uint)!bVar8 * auVar14._40_4_;
          bVar8 = (bool)(bVar4 >> 3 & 1);
          auVar12._44_4_ = (uint)bVar8 * auVar11._44_4_ | (uint)!bVar8 * auVar14._44_4_;
          bVar8 = (bool)(bVar4 >> 4 & 1);
          auVar12._48_4_ = (uint)bVar8 * auVar11._48_4_ | (uint)!bVar8 * auVar14._48_4_;
          bVar8 = (bool)(bVar4 >> 5 & 1);
          auVar12._52_4_ = (uint)bVar8 * auVar11._52_4_ | (uint)!bVar8 * auVar14._52_4_;
          bVar8 = (bool)(bVar4 >> 6 & 1);
          auVar12._56_4_ = (uint)bVar8 * auVar11._56_4_ | (uint)!bVar8 * auVar14._56_4_;
          auVar12._60_4_ =
               (uint)(bVar4 >> 7) * auVar11._60_4_ | (uint)!(bool)(bVar4 >> 7) * auVar14._60_4_;
          auVar10 = vextracti64x4_avx512f(auVar12,1);
          auVar11 = vpaddd_avx512f(auVar12,ZEXT3264(auVar10));
          auVar1 = vpaddd_avx(auVar11._0_16_,auVar11._16_16_);
          auVar2 = vpshufd_avx(auVar1,0xee);
          auVar1 = vpaddd_avx(auVar1,auVar2);
          auVar2 = vpshufd_avx(auVar1,0x55);
          auVar1 = vpaddd_avx(auVar1,auVar2);
          uVar16 = auVar1._0_4_;
        }
        bVar8 = uVar16 == uVar6;
      }
    }
    else {
      bVar8 = false;
    }
    if (local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    local_88._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00219948;
    PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_88);
  }
  local_60._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00219948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_60);
  return bVar8;
}

Assistant:

bool form5_Histogram(HistogramForm5 Histogram)
    {
        const uint8_t intensity = intensityValue();
        const PenguinV_Image::Image image = uniformImage( intensity );

        if ( image.height() / 2 == 0 )
            return true;

        PenguinV_Image::Image mask = image.generate( image.width(), image.height(), image.colorCount() );
        fillImage( mask, 0, 0, mask.width(), mask.height() / 2, 255 );
        fillImage( mask, 0, mask.height() / 2, mask.width(), mask.height() - mask.height() / 2, 0 );

        const std::vector < uint32_t > histogram = Histogram( image, mask );

        return histogram.size() == 256u && histogram[intensity] == image.width() * (image.height() / 2) &&
            std::accumulate( histogram.begin(), histogram.end(), 0u ) == image.width() * (image.height() / 2);
    }